

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::drawItems
          (QGraphicsScenePrivate *this,QPainter *painter,QTransform *viewTransform,
          QRegion *exposedRegion,QWidget *widget)

{
  long lVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  const_iterator o;
  QGraphicsScenePrivate *in_RCX;
  long in_RDX;
  QRect *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *subTree;
  QList<QGraphicsItem_*> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsItem_*> tli;
  QRectF exposedSceneRect;
  QTransform *in_stack_00000270;
  QList<QGraphicsItem_*> *in_stack_fffffffffffffeb0;
  QRectF *in_stack_fffffffffffffec0;
  const_iterator local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  qreal local_d8;
  qreal local_d0;
  QRegion *local_c8;
  QTransform *local_c0;
  undefined1 local_b8 [16];
  QRect local_a8;
  qreal local_98;
  qreal local_90;
  QRegion *local_88;
  QTransform *local_80;
  qreal local_78;
  qreal parentOpacity;
  QRegion *exposedRegion_00;
  QTransform *viewTransform_00;
  QPainter *in_stack_ffffffffffffffa8;
  QGraphicsItem *in_stack_ffffffffffffffb0;
  QGraphicsScenePrivate *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9d66db);
  if (!bVar3) {
    _q_polishItems(in_RCX);
  }
  in_RDI[0xb].x2.m_i = in_RDI[0xb].x2.m_i & 0xfffffffb;
  local_78 = -NAN;
  parentOpacity = -NAN;
  exposedRegion_00 = (QRegion *)0xffffffffffffffff;
  viewTransform_00 = (QTransform *)0xffffffffffffffff;
  QRectF::QRectF((QRectF *)&local_78);
  auVar2._8_8_ = local_b8._8_8_;
  auVar2._0_8_ = local_b8._0_8_;
  if ((in_RCX != (QGraphicsScenePrivate *)0x0) && (local_b8 = auVar2, in_RDI[8].y1.m_i != -1)) {
    local_b8 = QRegion::boundingRect();
    local_a8 = QRect::adjusted(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
                               (int)((ulong)in_RCX >> 0x20),(int)in_RCX);
    QRectF::QRectF(in_stack_fffffffffffffec0,in_RDI);
    local_78 = local_98;
    parentOpacity = local_90;
    exposedRegion_00 = local_88;
    viewTransform_00 = local_80;
    if (in_RDX != 0) {
      QTransform::inverted((bool *)&stack0xffffffffffffffa8);
      QTransform::mapRect((QRectF *)&local_d8);
      local_78 = local_d8;
      parentOpacity = local_d0;
      exposedRegion_00 = local_c8;
      viewTransform_00 = local_c0;
    }
  }
  local_f0 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  local_e0 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(**(long **)&in_RDI[8].x2 + 0x98))(&local_f0,*(long **)&in_RDI[8].x2,&local_78,0);
  local_f8.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_f8 = QList<QGraphicsItem_*>::begin(in_stack_fffffffffffffeb0);
  o = QList<QGraphicsItem_*>::end(in_stack_fffffffffffffeb0);
  while( true ) {
    bVar3 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_f8,o);
    if (!bVar3) break;
    QList<QGraphicsItem_*>::const_iterator::operator*(&local_f8);
    drawSubtreeRecursive
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               viewTransform_00,exposedRegion_00,(QWidget *)tli.d.size,parentOpacity,
               in_stack_00000270);
    QList<QGraphicsItem_*>::const_iterator::operator++(&local_f8);
  }
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9d6993);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::drawItems(QPainter *painter, const QTransform *const viewTransform,
                                      QRegion *exposedRegion, QWidget *widget)
{
    // Make sure we don't have unpolished items before we draw.
    if (!unpolishedItems.isEmpty())
        _q_polishItems();

    updateAll = false;
    QRectF exposedSceneRect;
    if (exposedRegion && indexMethod != QGraphicsScene::NoIndex) {
        exposedSceneRect = exposedRegion->boundingRect().adjusted(-1, -1, 1, 1);
        if (viewTransform)
            exposedSceneRect = viewTransform->inverted().mapRect(exposedSceneRect);
    }
    const QList<QGraphicsItem *> tli = index->estimateTopLevelItems(exposedSceneRect, Qt::AscendingOrder);
    for (const auto subTree : tli)
        drawSubtreeRecursive(subTree, painter, viewTransform, exposedRegion, widget);
}